

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O0

XMLError __thiscall tinyxml2::XMLDocument::Parse(XMLDocument *this,char *p,size_t len)

{
  bool bVar1;
  char *pcVar2;
  size_t local_28;
  size_t len_local;
  char *p_local;
  XMLDocument *this_local;
  
  Clear(this);
  if (((len == 0) || (p == (char *)0x0)) || (*p == '\0')) {
    SetError(this,XML_ERROR_EMPTY_DOCUMENT,0,(char *)0x0);
    this_local._4_4_ = this->_errorID;
  }
  else {
    local_28 = len;
    if (len == 0xffffffffffffffff) {
      local_28 = strlen(p);
    }
    pcVar2 = (char *)operator_new__(local_28 + 1);
    this->_charBuffer = pcVar2;
    memcpy(this->_charBuffer,p,local_28);
    this->_charBuffer[local_28] = '\0';
    Parse(this);
    bVar1 = Error(this);
    if (bVar1) {
      XMLNode::DeleteChildren(&this->super_XMLNode);
      MemPoolT<120>::Clear(&this->_elementPool);
      MemPoolT<80>::Clear(&this->_attributePool);
      MemPoolT<112>::Clear(&this->_textPool);
      MemPoolT<104>::Clear(&this->_commentPool);
    }
    this_local._4_4_ = this->_errorID;
  }
  return this_local._4_4_;
}

Assistant:

XMLError XMLDocument::Parse( const char* p, size_t len )
{
    Clear();

    if ( len == 0 || !p || !*p ) {
        SetError( XML_ERROR_EMPTY_DOCUMENT, 0, 0 );
        return _errorID;
    }
    if ( len == static_cast<size_t>(-1) ) {
        len = strlen( p );
    }
    TIXMLASSERT( _charBuffer == 0 );
    _charBuffer = new char[ len+1 ];
    memcpy( _charBuffer, p, len );
    _charBuffer[len] = 0;

    Parse();
    if ( Error() ) {
        // clean up now essentially dangling memory.
        // and the parse fail can put objects in the
        // pools that are dead and inaccessible.
        DeleteChildren();
        _elementPool.Clear();
        _attributePool.Clear();
        _textPool.Clear();
        _commentPool.Clear();
    }
    return _errorID;
}